

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O0

value_type_conflict1 __thiscall
standards::exp_number::operator_cast_to_double(exp_number<double> *this)

{
  double *in_RDI;
  double local_8;
  
  if (*(int *)(in_RDI + 1) == 1) {
    local_8 = exp(*in_RDI);
  }
  else if (*(int *)(in_RDI + 1) == -1) {
    local_8 = exp(*in_RDI);
    local_8 = -local_8;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

operator value_type() const {
    if (sign_ == is_positive)
      return std::exp(log_);
    else if (sign_ == is_negative)
      return -std::exp(log_);
    else
      return 0;
  }